

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::AvgState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::HugeintAverageOperation>
               (hugeint_t *idata,AggregateInputData *aggr_input_data,
               AvgState<duckdb::hugeint_t> **states,ValidityMask *mask,idx_t count)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  AggregateUnaryInput *pAVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  hugeint_t local_58;
  ulong local_48;
  AggregateUnaryInput *local_40;
  AggregateUnaryInput *local_38;
  
  local_58.lower = (uint64_t)aggr_input_data;
  local_58.upper = (int64_t)mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (local_48 = 0; local_48 < count; local_48 = local_48 + 1) {
      BaseSumOperation<duckdb::AverageSetOperation,duckdb::HugeintAdd>::
      Operation<duckdb::hugeint_t,duckdb::AvgState<duckdb::hugeint_t>,duckdb::HugeintAverageOperation>
                ((BaseSumOperation<duckdb::AverageSetOperation,duckdb::HugeintAdd> *)
                 states[local_48],(AvgState<duckdb::hugeint_t> *)(idata + local_48),&local_58,
                 (AggregateUnaryInput *)mask);
    }
  }
  else {
    local_48 = 0;
    local_40 = (AggregateUnaryInput *)(count + 0x3f >> 6);
    uVar9 = 0;
    pAVar5 = (AggregateUnaryInput *)0x0;
    uVar8 = 0;
    while (pAVar5 != local_40) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      local_38 = pAVar5;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar6 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar6 = count;
        }
LAB_00506870:
        while (uVar7 = uVar8, uVar3 = uVar9, uVar4 = local_48, uVar9 < uVar6) {
          BaseSumOperation<duckdb::AverageSetOperation,duckdb::HugeintAdd>::
          Operation<duckdb::hugeint_t,duckdb::AvgState<duckdb::hugeint_t>,duckdb::HugeintAverageOperation>
                    ((BaseSumOperation<duckdb::AverageSetOperation,duckdb::HugeintAdd> *)
                     states[uVar9],(AvgState<duckdb::hugeint_t> *)(idata + uVar9),&local_58,pAVar5);
          uVar9 = local_48 + 1;
          uVar8 = uVar9;
          local_48 = uVar9;
        }
      }
      else {
        uVar2 = puVar1[(long)pAVar5];
        uVar6 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar6 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_00506870;
        uVar7 = uVar6;
        uVar3 = uVar6;
        uVar4 = uVar6;
        if (uVar2 != 0) {
          while (uVar7 = uVar8, uVar3 = uVar8, uVar4 = local_48, uVar8 < uVar6) {
            if ((uVar2 >> ((ulong)(uint)((int)uVar8 - (int)uVar9) & 0x3f) & 1) != 0) {
              BaseSumOperation<duckdb::AverageSetOperation,duckdb::HugeintAdd>::
              Operation<duckdb::hugeint_t,duckdb::AvgState<duckdb::hugeint_t>,duckdb::HugeintAverageOperation>
                        ((BaseSumOperation<duckdb::AverageSetOperation,duckdb::HugeintAdd> *)
                         states[uVar8],(AvgState<duckdb::hugeint_t> *)(idata + uVar8),&local_58,
                         pAVar5);
              uVar8 = local_48;
            }
            uVar8 = uVar8 + 1;
            local_48 = uVar8;
          }
        }
      }
      local_48 = uVar4;
      uVar9 = uVar3;
      uVar8 = uVar7;
      pAVar5 = (AggregateUnaryInput *)((long)&local_38->input + 1);
    }
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}